

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 GenStateForEachNodeValidator(jx9_gen_state *pGen,jx9_expr_node *pRoot)

{
  sxu32 local_2c;
  sxi32 local_1c;
  sxi32 rc;
  jx9_expr_node *pRoot_local;
  jx9_gen_state *pGen_local;
  
  local_1c = 0;
  if (pRoot->xCode != jx9CompileVariable) {
    if (pRoot->pStart == (SyToken *)0x0) {
      local_2c = 0;
    }
    else {
      local_2c = pRoot->pStart->nLine;
    }
    local_1c = jx9GenCompileError(pGen,1,local_2c,"foreach: Expecting a variable name");
    if (local_1c != -10) {
      local_1c = -9;
    }
  }
  return local_1c;
}

Assistant:

static sxi32 GenStateForEachNodeValidator(jx9_gen_state *pGen,jx9_expr_node *pRoot)
{
	sxi32 rc = SXRET_OK; /* Assume a valid expression tree */
	if( pRoot->xCode != jx9CompileVariable ){
		/* Unexpected expression */
		rc = jx9GenCompileError(&(*pGen),
			E_ERROR,
			pRoot->pStart? pRoot->pStart->nLine : 0, 
			"foreach: Expecting a variable name"
			);
		if( rc != SXERR_ABORT ){
			rc = SXERR_INVALID;
		}
	}
	return rc;
}